

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_input_get_device_key_mapping_cookie_t
xcb_input_get_device_key_mapping
          (xcb_connection_t *c,uint8_t device_id,xcb_input_key_code_t first_keycode,uint8_t count)

{
  uint uVar1;
  long in_FS_OFFSET;
  undefined4 local_50;
  uint8_t local_4c;
  xcb_input_key_code_t local_4b;
  uint8_t local_4a;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  local_28 = &local_50;
  local_50 = 0xaaaaaaaa;
  local_49 = 0;
  local_20 = 8;
  local_18 = 0;
  uStack_10 = 0;
  local_4c = device_id;
  local_4b = first_keycode;
  local_4a = count;
  uVar1 = xcb_send_request(c,1,&local_28,&xcb_input_get_device_key_mapping::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_input_get_device_key_mapping_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_input_get_device_key_mapping_cookie_t
xcb_input_get_device_key_mapping (xcb_connection_t     *c,
                                  uint8_t               device_id,
                                  xcb_input_key_code_t  first_keycode,
                                  uint8_t               count)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 2,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_GET_DEVICE_KEY_MAPPING,
        .isvoid = 0
    };

    struct iovec xcb_parts[4];
    xcb_input_get_device_key_mapping_cookie_t xcb_ret;
    xcb_input_get_device_key_mapping_request_t xcb_out;

    xcb_out.device_id = device_id;
    xcb_out.first_keycode = first_keycode;
    xcb_out.count = count;
    xcb_out.pad0 = 0;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, XCB_REQUEST_CHECKED, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}